

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string local_908;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> local_8e8;
  
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_908);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend(&local_8e8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::ClassId(&local_8e8);
  local_8e8.super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoBlend_018b6360;
  lVar4 = 0x720;
  do {
    TPZTransform<double>::~TPZTransform
              ((TPZTransform<double> *)
               ((long)local_8e8.super_TPZGeoTriangle.super_TPZNodeRep<3,_pztopology::TPZTriangle>.
                      fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + -0x1a0;
  } while (lVar4 != -0x100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}